

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR range_part_check_ascendancy
                 (ly_bool unsigned_value,ly_bool max,int64_t value,int64_t prev_value)

{
  int64_t prev_value_local;
  int64_t value_local;
  ly_bool max_local;
  ly_bool unsigned_value_local;
  
  if (unsigned_value == '\0') {
    if (((max != '\0') && (value < prev_value)) || ((max == '\0' && (value <= prev_value)))) {
      return LY_EEXIST;
    }
  }
  else if (((max != '\0') && ((ulong)value < (ulong)prev_value)) ||
          ((max == '\0' && ((ulong)value <= (ulong)prev_value)))) {
    return LY_EEXIST;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
range_part_check_ascendancy(ly_bool unsigned_value, ly_bool max, int64_t value, int64_t prev_value)
{
    if (unsigned_value) {
        if ((max && ((uint64_t)prev_value > (uint64_t)value)) || (!max && ((uint64_t)prev_value >= (uint64_t)value))) {
            return LY_EEXIST;
        }
    } else {
        if ((max && (prev_value > value)) || (!max && (prev_value >= value))) {
            return LY_EEXIST;
        }
    }
    return LY_SUCCESS;
}